

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Create_Entity_R_PDU.cpp
# Opt level: O2

void __thiscall
KDIS::PDU::Create_Entity_R_PDU::Create_Entity_R_PDU
          (Create_Entity_R_PDU *this,EntityIdentifier *OrigintatingID,EntityIdentifier *ReceivingID,
          KUINT32 RequestID,RequiredReliabilityService RRS)

{
  Create_Entity_PDU::Create_Entity_PDU
            (&this->super_Create_Entity_PDU,OrigintatingID,ReceivingID,RequestID);
  Reliability_Header::Reliability_Header(&this->super_Reliability_Header,RRS);
  (this->super_Create_Entity_PDU).super_Simulation_Management_Header.super_Header.super_Header6.
  _vptr_Header6 = (_func_int **)&PTR__Create_Entity_R_PDU_00216a00;
  (this->super_Reliability_Header)._vptr_Reliability_Header =
       (_func_int **)&PTR__Create_Entity_R_PDU_00216a40;
  (this->super_Create_Entity_PDU).super_Simulation_Management_Header.super_Header.super_Header6.
  m_ui8PDUType = '3';
  (this->super_Create_Entity_PDU).super_Simulation_Management_Header.super_Header.super_Header6.
  m_ui8ProtocolFamily = '\n';
  (this->super_Create_Entity_PDU).super_Simulation_Management_Header.super_Header.super_Header6.
  m_ui16PDULength = 0x20;
  (this->super_Create_Entity_PDU).super_Simulation_Management_Header.super_Header.super_Header6.
  m_ui8ProtocolVersion = '\x06';
  return;
}

Assistant:

Create_Entity_R_PDU::Create_Entity_R_PDU( const EntityIdentifier & OrigintatingID, const EntityIdentifier & ReceivingID,
        KUINT32 RequestID, RequiredReliabilityService RRS ) :
    Create_Entity_PDU( OrigintatingID, ReceivingID, RequestID ),
    Reliability_Header( RRS )
{
    m_ui8PDUType = CreateEntity_R_PDU_Type;
    m_ui16PDULength = CREATE_ENTITY_R_PDU_SIZE;
    m_ui8ProtocolVersion = IEEE_1278_1A_1998;
    m_ui8ProtocolFamily = SimulationManagementwithReliability;
}